

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.h
# Opt level: O2

void __thiscall vec<Branching_*>::moveTo(vec<Branching_*> *this,vec<Branching_*> *dest)

{
  uint uVar1;
  
  clear(dest,true);
  dest->data = this->data;
  uVar1 = this->cap;
  dest->sz = this->sz;
  dest->cap = uVar1;
  this->sz = 0;
  this->cap = 0;
  this->data = (Branching **)0x0;
  return;
}

Assistant:

void moveTo(vec<T>& dest) {
		dest.clear(true);
		dest.data = data;
		dest.sz = sz;
		dest.cap = cap;
		data = nullptr;
		sz = 0;
		cap = 0;
	}